

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcryptohash-sha2-512.c
# Opt level: O3

void p_crypto_hash_sha2_512_finish(PHashSHA2_512 *ctx)

{
  puint64 *ppVar1;
  int iVar2;
  puint64 pVar3;
  ulong uVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [11];
  undefined1 auVar39 [15];
  undefined1 auVar40 [11];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  uint uVar45;
  uint uVar46;
  long lVar47;
  uint uVar48;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [11];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar52 [11];
  undefined1 auVar57 [16];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  
  pVar3 = ctx->len_high;
  uVar4 = ctx->len_low;
  uVar48 = (uint)uVar4 & 0x7f;
  uVar45 = (uint)(0x6f < uVar48) << 7 | 0x70;
  uVar46 = uVar45 - uVar48;
  if (uVar46 != 0 && uVar48 <= uVar45) {
    p_crypto_hash_sha2_512_update(ctx,pp_crypto_hash_sha2_512_pad,(ulong)uVar46);
  }
  (ctx->buf).buf_w[0xe] = pVar3 << 3 | uVar4 >> 0x3d;
  (ctx->buf).buf_w[0xf] = uVar4 << 3;
  lVar47 = 0;
  do {
    auVar49 = *(undefined1 (*) [16])(ctx->hash + lVar47 + -0x10);
    auVar56[8] = auVar49[8];
    auVar56[9] = 0;
    auVar56[10] = auVar49[9];
    auVar51._0_10_ = (unkuint10)auVar49[0xc] << 0x40;
    auVar51[10] = auVar49[0xd];
    auVar53[0xb] = 0;
    auVar53._0_11_ = auVar51;
    auVar53[0xc] = auVar49[0xe];
    auVar53[0xd] = 0;
    auVar53[0xe] = auVar49[0xf];
    auVar56[3] = 0;
    auVar56._0_3_ = auVar51._8_3_;
    auVar56._4_3_ = auVar53._12_3_;
    auVar56[7] = 0;
    auVar56[0xb] = 0;
    auVar56._12_3_ = (int3)(CONCAT16(auVar49[0xb],(uint6)auVar49[10] << 0x20) >> 0x20);
    auVar56[0xf] = 0;
    auVar55 = pshuflw(auVar56,auVar56,0x1b);
    auVar56 = pshufhw(auVar55,auVar55,0x1b);
    auVar21[0xd] = 0;
    auVar21._0_13_ = auVar49._0_13_;
    auVar21[0xe] = auVar49[7];
    auVar23[0xc] = auVar49[6];
    auVar23._0_12_ = auVar49._0_12_;
    auVar23._13_2_ = auVar21._13_2_;
    auVar25[0xb] = 0;
    auVar25._0_11_ = auVar49._0_11_;
    auVar25._12_3_ = auVar23._12_3_;
    auVar27[10] = auVar49[5];
    auVar27._0_10_ = auVar49._0_10_;
    auVar27._11_4_ = auVar25._11_4_;
    auVar29[9] = 0;
    auVar29._0_9_ = auVar49._0_9_;
    auVar29._10_5_ = auVar27._10_5_;
    auVar31[8] = auVar49[4];
    auVar31._0_8_ = auVar49._0_8_;
    auVar31._9_6_ = auVar29._9_6_;
    auVar55[7] = 0;
    auVar55._0_7_ = auVar31._8_7_;
    auVar37._7_8_ = 0;
    auVar37._0_7_ = auVar31._8_7_;
    auVar41._1_8_ = SUB158(auVar37 << 0x40,7);
    auVar41[0] = auVar49[3];
    auVar41._9_6_ = 0;
    auVar38._1_10_ = SUB1510(auVar41 << 0x30,5);
    auVar38[0] = auVar49[2];
    auVar42._11_4_ = 0;
    auVar42._0_11_ = auVar38;
    auVar33[2] = auVar49[1];
    auVar33._0_2_ = auVar49._0_2_;
    auVar33._3_12_ = SUB1512(auVar42 << 0x20,3);
    auVar35._2_13_ = auVar33._2_13_;
    auVar35._0_2_ = auVar49._0_2_ & 0xff;
    auVar55._8_4_ = auVar35._0_4_;
    auVar55._12_4_ = auVar38._0_4_;
    auVar49 = pshuflw(auVar55,auVar55,0x1b);
    auVar49 = pshufhw(auVar49,auVar49,0x1b);
    sVar5 = auVar49._0_2_;
    sVar6 = auVar49._2_2_;
    sVar7 = auVar49._4_2_;
    sVar8 = auVar49._6_2_;
    sVar9 = auVar49._8_2_;
    sVar10 = auVar49._10_2_;
    sVar11 = auVar49._12_2_;
    sVar12 = auVar49._14_2_;
    sVar13 = auVar56._0_2_;
    sVar14 = auVar56._2_2_;
    sVar15 = auVar56._4_2_;
    sVar16 = auVar56._6_2_;
    sVar17 = auVar56._8_2_;
    sVar18 = auVar56._10_2_;
    sVar19 = auVar56._12_2_;
    sVar20 = auVar56._14_2_;
    ppVar1 = ctx->hash + lVar47 + -0x10;
    *(char *)ppVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar49[0] - (0xff < sVar5);
    *(char *)((long)ppVar1 + 1) = (0 < sVar6) * (sVar6 < 0x100) * auVar49[2] - (0xff < sVar6);
    *(char *)((long)ppVar1 + 2) = (0 < sVar7) * (sVar7 < 0x100) * auVar49[4] - (0xff < sVar7);
    *(char *)((long)ppVar1 + 3) = (0 < sVar8) * (sVar8 < 0x100) * auVar49[6] - (0xff < sVar8);
    *(char *)((long)ppVar1 + 4) = (0 < sVar9) * (sVar9 < 0x100) * auVar49[8] - (0xff < sVar9);
    *(char *)((long)ppVar1 + 5) = (0 < sVar10) * (sVar10 < 0x100) * auVar49[10] - (0xff < sVar10);
    *(char *)((long)ppVar1 + 6) = (0 < sVar11) * (sVar11 < 0x100) * auVar49[0xc] - (0xff < sVar11);
    *(char *)((long)ppVar1 + 7) = (0 < sVar12) * (sVar12 < 0x100) * auVar49[0xe] - (0xff < sVar12);
    *(char *)(ppVar1 + 1) = (0 < sVar13) * (sVar13 < 0x100) * auVar56[0] - (0xff < sVar13);
    *(char *)((long)ppVar1 + 9) = (0 < sVar14) * (sVar14 < 0x100) * auVar56[2] - (0xff < sVar14);
    *(char *)((long)ppVar1 + 10) = (0 < sVar15) * (sVar15 < 0x100) * auVar56[4] - (0xff < sVar15);
    *(char *)((long)ppVar1 + 0xb) = (0 < sVar16) * (sVar16 < 0x100) * auVar56[6] - (0xff < sVar16);
    *(char *)((long)ppVar1 + 0xc) = (0 < sVar17) * (sVar17 < 0x100) * auVar56[8] - (0xff < sVar17);
    *(char *)((long)ppVar1 + 0xd) = (0 < sVar18) * (sVar18 < 0x100) * auVar56[10] - (0xff < sVar18);
    *(char *)((long)ppVar1 + 0xe) = (0 < sVar19) * (sVar19 < 0x100) * auVar56[0xc] - (0xff < sVar19)
    ;
    *(char *)((long)ppVar1 + 0xf) = (0 < sVar20) * (sVar20 < 0x100) * auVar56[0xe] - (0xff < sVar20)
    ;
    lVar47 = lVar47 + 2;
  } while (lVar47 != 0xe);
  pp_crypto_hash_sha2_512_process(ctx,(puint64 *)ctx);
  iVar2 = ctx->is384;
  lVar47 = 0;
  do {
    auVar49 = *(undefined1 (*) [16])(ctx->hash + lVar47);
    auVar57[8] = auVar49[8];
    auVar57[9] = 0;
    auVar57[10] = auVar49[9];
    auVar52._0_10_ = (unkuint10)auVar49[0xc] << 0x40;
    auVar52[10] = auVar49[0xd];
    auVar54[0xb] = 0;
    auVar54._0_11_ = auVar52;
    auVar54[0xc] = auVar49[0xe];
    auVar54[0xd] = 0;
    auVar54[0xe] = auVar49[0xf];
    auVar57[3] = 0;
    auVar57._0_3_ = auVar52._8_3_;
    auVar57._4_3_ = auVar54._12_3_;
    auVar57[7] = 0;
    auVar57[0xb] = 0;
    auVar57._12_3_ = (int3)(CONCAT16(auVar49[0xb],(uint6)auVar49[10] << 0x20) >> 0x20);
    auVar57[0xf] = 0;
    auVar55 = pshuflw(auVar57,auVar57,0x1b);
    auVar55 = pshufhw(auVar55,auVar55,0x1b);
    auVar22[0xd] = 0;
    auVar22._0_13_ = auVar49._0_13_;
    auVar22[0xe] = auVar49[7];
    auVar24[0xc] = auVar49[6];
    auVar24._0_12_ = auVar49._0_12_;
    auVar24._13_2_ = auVar22._13_2_;
    auVar26[0xb] = 0;
    auVar26._0_11_ = auVar49._0_11_;
    auVar26._12_3_ = auVar24._12_3_;
    auVar28[10] = auVar49[5];
    auVar28._0_10_ = auVar49._0_10_;
    auVar28._11_4_ = auVar26._11_4_;
    auVar30[9] = 0;
    auVar30._0_9_ = auVar49._0_9_;
    auVar30._10_5_ = auVar28._10_5_;
    auVar32[8] = auVar49[4];
    auVar32._0_8_ = auVar49._0_8_;
    auVar32._9_6_ = auVar30._9_6_;
    auVar50[7] = 0;
    auVar50._0_7_ = auVar32._8_7_;
    auVar39._7_8_ = 0;
    auVar39._0_7_ = auVar32._8_7_;
    auVar43._1_8_ = SUB158(auVar39 << 0x40,7);
    auVar43[0] = auVar49[3];
    auVar43._9_6_ = 0;
    auVar40._1_10_ = SUB1510(auVar43 << 0x30,5);
    auVar40[0] = auVar49[2];
    auVar44._11_4_ = 0;
    auVar44._0_11_ = auVar40;
    auVar34[2] = auVar49[1];
    auVar34._0_2_ = auVar49._0_2_;
    auVar34._3_12_ = SUB1512(auVar44 << 0x20,3);
    auVar36._2_13_ = auVar34._2_13_;
    auVar36._0_2_ = auVar49._0_2_ & 0xff;
    auVar50._8_4_ = auVar36._0_4_;
    auVar50._12_4_ = auVar40._0_4_;
    auVar49 = pshuflw(auVar50,auVar50,0x1b);
    auVar49 = pshufhw(auVar49,auVar49,0x1b);
    sVar5 = auVar49._0_2_;
    sVar6 = auVar49._2_2_;
    sVar7 = auVar49._4_2_;
    sVar8 = auVar49._6_2_;
    sVar9 = auVar49._8_2_;
    sVar10 = auVar49._10_2_;
    sVar11 = auVar49._12_2_;
    sVar12 = auVar49._14_2_;
    sVar13 = auVar55._0_2_;
    sVar14 = auVar55._2_2_;
    sVar15 = auVar55._4_2_;
    sVar16 = auVar55._6_2_;
    sVar17 = auVar55._8_2_;
    sVar18 = auVar55._10_2_;
    sVar19 = auVar55._12_2_;
    sVar20 = auVar55._14_2_;
    ppVar1 = ctx->hash + lVar47;
    *(char *)ppVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar49[0] - (0xff < sVar5);
    *(char *)((long)ppVar1 + 1) = (0 < sVar6) * (sVar6 < 0x100) * auVar49[2] - (0xff < sVar6);
    *(char *)((long)ppVar1 + 2) = (0 < sVar7) * (sVar7 < 0x100) * auVar49[4] - (0xff < sVar7);
    *(char *)((long)ppVar1 + 3) = (0 < sVar8) * (sVar8 < 0x100) * auVar49[6] - (0xff < sVar8);
    *(char *)((long)ppVar1 + 4) = (0 < sVar9) * (sVar9 < 0x100) * auVar49[8] - (0xff < sVar9);
    *(char *)((long)ppVar1 + 5) = (0 < sVar10) * (sVar10 < 0x100) * auVar49[10] - (0xff < sVar10);
    *(char *)((long)ppVar1 + 6) = (0 < sVar11) * (sVar11 < 0x100) * auVar49[0xc] - (0xff < sVar11);
    *(char *)((long)ppVar1 + 7) = (0 < sVar12) * (sVar12 < 0x100) * auVar49[0xe] - (0xff < sVar12);
    *(char *)(ppVar1 + 1) = (0 < sVar13) * (sVar13 < 0x100) * auVar55[0] - (0xff < sVar13);
    *(char *)((long)ppVar1 + 9) = (0 < sVar14) * (sVar14 < 0x100) * auVar55[2] - (0xff < sVar14);
    *(char *)((long)ppVar1 + 10) = (0 < sVar15) * (sVar15 < 0x100) * auVar55[4] - (0xff < sVar15);
    *(char *)((long)ppVar1 + 0xb) = (0 < sVar16) * (sVar16 < 0x100) * auVar55[6] - (0xff < sVar16);
    *(char *)((long)ppVar1 + 0xc) = (0 < sVar17) * (sVar17 < 0x100) * auVar55[8] - (0xff < sVar17);
    *(char *)((long)ppVar1 + 0xd) = (0 < sVar18) * (sVar18 < 0x100) * auVar55[10] - (0xff < sVar18);
    *(char *)((long)ppVar1 + 0xe) = (0 < sVar19) * (sVar19 < 0x100) * auVar55[0xc] - (0xff < sVar19)
    ;
    *(char *)((long)ppVar1 + 0xf) = (0 < sVar20) * (sVar20 < 0x100) * auVar55[0xe] - (0xff < sVar20)
    ;
    lVar47 = lVar47 + 2;
  } while ((ulong)(iVar2 == 0) * 2 + 6 != lVar47);
  return;
}

Assistant:

void
p_crypto_hash_sha2_512_finish (PHashSHA2_512 *ctx)
{
	puint64	high;
	puint64	low;
	pint	left;
	pint	last;

	left = (pint) (ctx->len_low & 0x7F);
	last = (left < 112) ? (112 - left) : (240 - left);

	low = ctx->len_low << 3;
	high = ctx->len_high << 3
	     | ctx->len_low >> 61;

	if (last > 0)
		p_crypto_hash_sha2_512_update (ctx, pp_crypto_hash_sha2_512_pad, (psize) last);

	ctx->buf.buf_w[14] = high;
	ctx->buf.buf_w[15] = low;

	pp_crypto_hash_sha2_512_swap_bytes (ctx->buf.buf_w, 14);
	pp_crypto_hash_sha2_512_process (ctx, ctx->buf.buf_w);

	pp_crypto_hash_sha2_512_swap_bytes (ctx->hash, ctx->is384 == FALSE ? 8 : 6);
}